

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_manager.cpp
# Opt level: O2

void __thiscall cfd::CfdManager::Initialize(CfdManager *this)

{
  CfdException *this_00;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (this->finalized_ != true) {
    if (this->initialized_ == false) {
      core::Initialize(&this->handle_);
      this->initialized_ = true;
      local_38._0_8_ = "cfd_manager.cpp";
      local_38._8_4_ = 0x2f;
      local_38._16_8_ = "Initialize";
      core::logger::info<>((CfdSourceLocation *)local_38,"cfd initialize.");
    }
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_38,"Initialize already finalized.",&local_39);
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CfdManager::Initialize() {
  if (finalized_) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Initialize already finalized.");
  }

  if (!initialized_) {
    cfd::core::Initialize(&handle_);
    initialized_ = true;
    info(CFD_LOG_SOURCE, "cfd initialize.");
  }
}